

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher.c
# Opt level: O0

mbedtls_cipher_info_t * mbedtls_cipher_info_from_string(char *cipher_name)

{
  int iVar1;
  mbedtls_cipher_definition_t *local_20;
  mbedtls_cipher_definition_t *def;
  char *cipher_name_local;
  
  if (cipher_name != (char *)0x0) {
    for (local_20 = mbedtls_cipher_definitions; local_20->info != (mbedtls_cipher_info_t *)0x0;
        local_20 = local_20 + 1) {
      iVar1 = strcmp(local_20->info->name,cipher_name);
      if (iVar1 == 0) {
        return local_20->info;
      }
    }
  }
  return (mbedtls_cipher_info_t *)0x0;
}

Assistant:

const mbedtls_cipher_info_t *mbedtls_cipher_info_from_string( const char *cipher_name )
{
    const mbedtls_cipher_definition_t *def;

    if( NULL == cipher_name )
        return( NULL );

    for( def = mbedtls_cipher_definitions; def->info != NULL; def++ )
        if( !  strcmp( def->info->name, cipher_name ) )
            return( def->info );

    return( NULL );
}